

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  reference ppTVar3;
  char *pcVar4;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar5;
  TestInfo *pTVar6;
  reference ppTVar7;
  bool local_119;
  byte local_10f;
  byte local_10e;
  bool local_10d;
  bool local_10a;
  int local_d0;
  int local_cc;
  allocator local_b9;
  undefined1 local_b8 [2];
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  allocator local_71;
  string local_70;
  string *local_50;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int local_20;
  int num_selected_tests;
  int num_runnable_tests;
  int32_t shard_index;
  int32_t total_shards;
  ReactionToSharding shard_tests_local;
  UnitTestImpl *this_local;
  
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_cc = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_d0 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_cc = -1;
    local_d0 = -1;
  }
  local_20 = 0;
  __range2._4_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         (&this->test_suites_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                     *)&test_suite), bVar1) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    test_suite_name = (string *)*ppTVar3;
    pcVar4 = TestSuite::name((TestSuite *)test_suite_name);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,pcVar4,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_50 = &local_70;
    TestSuite::set_should_run((TestSuite *)test_suite_name,false);
    test_info = (TestInfo *)0x0;
    while( true ) {
      pvVar5 = TestSuite::test_info_list((TestSuite *)test_suite_name);
      pTVar6 = (TestInfo *)
               std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size(pvVar5);
      if (pTVar6 <= test_info) break;
      pvVar5 = TestSuite::test_info_list((TestSuite *)test_suite_name);
      ppTVar7 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar5,(size_type)test_info);
      test_name.field_2._8_8_ = *ppTVar7;
      pcVar4 = TestInfo::name((TestInfo *)test_name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_b8,pcVar4,&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      bVar1 = UnitTestOptions::MatchesFilter(local_50,"DISABLED_*:*/DISABLED_*");
      local_10a = true;
      if (!bVar1) {
        local_10a = UnitTestOptions::MatchesFilter((string *)local_b8,"DISABLED_*:*/DISABLED_*");
      }
      *(bool *)(test_name.field_2._8_8_ + 0x81) = local_10a;
      bVar1 = UnitTestOptions::FilterMatchesTest(local_50,(string *)local_b8);
      *(bool *)(test_name.field_2._8_8_ + 0x82) = bVar1;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_10d = false, local_10a == false)) {
        local_10d = bVar1;
      }
      local_10e = 0;
      if (shard_tests != IGNORE_SHARDING_PROTOCOL) {
        bVar1 = ShouldRunTestOnShard(local_cc,local_d0,local_20);
        local_10e = bVar1 ^ 0xff;
      }
      this_00 = test_suite_name;
      *(byte *)(test_name.field_2._8_8_ + 0x83) = local_10e & 1;
      local_10f = 0;
      if (local_10d != false) {
        local_10f = local_10e & 1 ^ 0xff;
      }
      bVar1 = (bool)(local_10f & 1);
      local_20 = local_20 + (uint)local_10d;
      __range2._4_4_ = __range2._4_4_ + (uint)bVar1;
      *(bool *)(test_name.field_2._8_8_ + 0x80) = bVar1;
      bVar2 = TestSuite::should_run((TestSuite *)test_suite_name);
      local_119 = true;
      if (!bVar2) {
        local_119 = bVar1;
      }
      TestSuite::set_should_run((TestSuite *)this_00,local_119);
      std::__cxx11::string::~string((string *)local_b8);
      test_info = (TestInfo *)&(test_info->test_suite_name_).field_0x1;
    }
    std::__cxx11::string::~string((string *)&local_70);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  return __range2._4_4_;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}